

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall Js::JavascriptArray::ValidateArrayCommon(JavascriptArray *this)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  DynamicObjectFlags DVar6;
  uint uVar7;
  undefined4 *puVar8;
  SegmentBTreeRoot *this_00;
  uint uVar9;
  Type *pTVar10;
  byte bVar11;
  SparseArraySegmentBase *seg;
  ArraySegmentsVisitor local_48;
  ArraySegmentsVisitor visitor;
  
  DVar6 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  seg = (this->head).ptr;
  pTVar10 = (Type *)((long)this->segmentUnion + 0x20);
  if ((DVar6 & HasSegmentMap) == None) {
    pTVar10 = &this->segmentUnion;
  }
  visitor.seg = (pTVar10->lastUsedSegment).ptr;
  if (visitor.seg == (SparseArraySegmentBase *)0x0 || seg == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4c,"(this != nullptr && head && lastUsedSegment)",
                                "Array should not be null");
    if (!bVar4) goto LAB_00b84c76;
    *puVar8 = 0;
    seg = (this->head).ptr;
  }
  if (seg->left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4d,"(head->left == 0)",
                                "Array always should have a segment starting at zero");
    if (!bVar4) goto LAB_00b84c76;
    *puVar8 = 0;
    seg = (this->head).ptr;
    if (seg == (SparseArraySegmentBase *)0x0) {
LAB_00b84be0:
      DVar6 = DynamicObject::GetArrayFlags((DynamicObject *)this);
      if ((DVar6 & HasSegmentMap) == None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e6a,"(foundLastUsedSegment || HasSegmentMap())",
                                    "Corrupt lastUsedSegment in array header");
        if (!bVar4) goto LAB_00b84c76;
        *puVar8 = 0;
      }
LAB_00b84c3d:
      DVar6 = DynamicObject::GetArrayFlags((DynamicObject *)this);
      if ((DVar6 & HasSegmentMap) != None) {
        local_48.seg = (this->head).ptr;
        this_00 = GetSegmentMap(this);
        SegmentBTree::Walk<ArraySegmentsVisitor>(&this_00->super_SegmentBTree,&local_48);
      }
      return;
    }
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  bVar3 = 0;
  while( true ) {
    bVar4 = seg == visitor.seg;
    if (seg->size < seg->length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e59,"(seg->length <= seg->size)",
                                  "Length greater than size not possible");
      if (!bVar5) goto LAB_00b84c76;
      *puVar8 = 0;
    }
    bVar11 = bVar3 | bVar4;
    pSVar1 = (seg->next).ptr;
    if (pSVar1 == (SparseArraySegmentBase *)0x0) break;
    uVar9 = seg->left;
    uVar7 = pSVar1->left;
    if (uVar7 <= uVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e5e,"(seg->left < next->left)",
                                  "Segment is adjacent to or overlaps with next segment");
      if (!bVar4) goto LAB_00b84c76;
      *puVar8 = 0;
      uVar7 = pSVar1->left;
      uVar9 = seg->left;
    }
    if (uVar7 - uVar9 < seg->size) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e5f,"(seg->size <= (next->left - seg->left))",
                                  "Segment is adjacent to or overlaps with next segment");
      if (!bVar4) goto LAB_00b84c76;
      *puVar8 = 0;
    }
    bVar4 = SparseArraySegmentBase::IsLeafSegment
                      (seg,((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject
                                .type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                            scriptContext.ptr)->recycler);
    seg = pSVar1;
    bVar3 = bVar11;
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e60,
                                  "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))"
                                  ,"Leaf segment with a next pointer");
      if (!bVar4) goto LAB_00b84c76;
      *puVar8 = 0;
    }
  }
  uVar9 = seg->left;
  uVar7 = seg->length;
  if (CARRY4(uVar9,uVar7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e64,"(seg->length <= MaxArrayLength - seg->left)",
                                "Segment index range overflow");
    if (!bVar5) goto LAB_00b84c76;
    *puVar8 = 0;
    uVar9 = seg->left;
    uVar7 = seg->length;
  }
  if ((this->super_ArrayObject).length < uVar7 + uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e65,"(seg->left + seg->length <= this->length)",
                                "Segment index range exceeds array length");
    if (!bVar5) {
LAB_00b84c76:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (!(bool)(bVar3 | bVar4)) goto LAB_00b84be0;
  goto LAB_00b84c3d;
}

Assistant:

void JavascriptArray::ValidateArrayCommon()
    {
        SparseArraySegmentBase * lastUsedSegment = this->GetLastUsedSegment();
        AssertMsg(this != nullptr && head && lastUsedSegment, "Array should not be null");
        AssertMsg(head->left == 0, "Array always should have a segment starting at zero");

        // Simple segments validation
        bool foundLastUsedSegment = false;
        SparseArraySegmentBase *seg = head;
        while(seg != nullptr)
        {
            if (seg == lastUsedSegment)
            {
                foundLastUsedSegment = true;
            }

            AssertMsg(seg->length <= seg->size , "Length greater than size not possible");

            SparseArraySegmentBase* next = seg->next;
            if (next != nullptr)
            {
                AssertMsg(seg->left < next->left, "Segment is adjacent to or overlaps with next segment");
                AssertMsg(seg->size <= (next->left - seg->left), "Segment is adjacent to or overlaps with next segment");
                AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
            }
            else
            {
                AssertMsg(seg->length <= MaxArrayLength - seg->left, "Segment index range overflow");
                AssertMsg(seg->left + seg->length <= this->length, "Segment index range exceeds array length");
            }

            seg = next;
        }
        AssertMsg(foundLastUsedSegment || HasSegmentMap(), "Corrupt lastUsedSegment in array header");

        // Validate segmentMap if present
        if (HasSegmentMap())
        {
            ArraySegmentsVisitor visitor(head);
            GetSegmentMap()->Walk(visitor);
        }
    }